

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O0

bool __thiscall DreamExternalTester::testOptimization(DreamExternalTester *this)

{
  bool bVar1;
  test_result local_12;
  DreamExternalTester *pDStack_10;
  test_result test;
  DreamExternalTester *this_local;
  
  pDStack_10 = this;
  test_result::test_result(&local_12);
  bVar1 = TasOptimization::testParticleSwarmState((bool)(this->verbose & 1));
  test_result::tassert(&local_12,bVar1);
  bVar1 = TasOptimization::testParticleSwarm((bool)(this->verbose & 1));
  test_result::tassert(&local_12,bVar1);
  bVar1 = test_result::last_success(&local_12);
  reportPassFail(bVar1,"Optimization","Particle Swarm");
  bVar1 = TasOptimization::testGradientDescentState((bool)(this->verbose & 1));
  test_result::tassert(&local_12,bVar1);
  bVar1 = TasOptimization::testGradientDescent((bool)(this->verbose & 1));
  test_result::tassert(&local_12,bVar1);
  bVar1 = test_result::last_success(&local_12);
  reportPassFail(bVar1,"Optimization","Gradient Descent");
  bVar1 = test_result::success(&local_12);
  return bVar1;
}

Assistant:

bool DreamExternalTester::testOptimization(){
    test_result test;

    // Test Particle Swarm State and Algorithm.
    test.tassert(TasOptimization::testParticleSwarmState(verbose));
    test.tassert(TasOptimization::testParticleSwarm(verbose));
    reportPassFail(test.last_success(), "Optimization", "Particle Swarm");

    // Test Gradient Descent State and Algorithm.
    test.tassert(TasOptimization::testGradientDescentState(verbose));
    test.tassert(TasOptimization::testGradientDescent(verbose));
    reportPassFail(test.last_success(), "Optimization", "Gradient Descent");

    return test.success();
}